

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O1

optional<unsigned_long_long> __thiscall QMetaEnum::value64(QMetaEnum *this,int index)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  QMetaObject *pQVar4;
  uint *puVar5;
  uint *puVar6;
  QMetaTypeInterface *pQVar7;
  undefined8 in_RAX;
  ulong uVar8;
  _Storage<unsigned_long_long,_true> _Var9;
  _Storage<unsigned_long_long,_true> _Var10;
  int iVar11;
  optional<unsigned_long_long> oVar12;
  optional<unsigned_long_long> oVar13;
  
  pQVar4 = this->mobj;
  uVar8 = CONCAT71((int7)((ulong)in_RAX >> 8),pQVar4 == (QMetaObject *)0x0);
  if (-1 < index && pQVar4 != (QMetaObject *)0x0) {
    puVar5 = (this->data).d;
    uVar1 = puVar5[3];
    uVar8 = (ulong)uVar1;
    if (index < (int)uVar1) {
      iVar11 = 0x40;
      if (((puVar5[2] & 0x40) == 0) && (iVar11 = 0, (puVar5[2] & 1) == 0)) {
        puVar6 = (pQVar4->d).data;
        pQVar7 = (pQVar4->d).metaTypes
                 [(long)(int)puVar6[6] +
                  (ulong)((int)((ulong)((long)puVar5 - (long)puVar6) >> 2) - puVar6[9]) / 5];
        if (pQVar7 == (QMetaTypeInterface *)0x0) {
          iVar11 = -1;
        }
        else {
          iVar11 = ((pQVar7->flags >> 8 & 1) != 0) - 1;
        }
      }
      puVar6 = (pQVar4->d).data;
      uVar2 = puVar5[4];
      uVar3 = puVar6[uVar2 + index * 2 + 1];
      _Var10._M_value._4_4_ = 0;
      _Var10._M_value._0_4_ = uVar3;
      if (iVar11 < 1) {
        _Var9 = (_Storage<unsigned_long_long,_true>)(long)(int)uVar3;
        if (iVar11 == 0) {
          _Var9 = _Var10;
        }
      }
      else {
        _Var9._M_value._4_4_ = puVar6[index + uVar1 * 2 + uVar2];
        _Var9._M_value._0_4_ = uVar3;
      }
      oVar13.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long_long>._12_4_ = 0;
      oVar13.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long_long>._9_3_ = (uint3)(uVar2 >> 8);
      oVar13.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long_long>._M_engaged = true;
      oVar13.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long_long>._M_payload._M_value = _Var9._M_value;
      return (optional<unsigned_long_long>)
             oVar13.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long_long>;
    }
  }
  oVar12.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long_long>._8_8_ = 0;
  oVar12.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long_long>._M_payload =
       (_Storage<unsigned_long_long,_true>)uVar8;
  return (optional<unsigned_long_long>)
         oVar12.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long_long>;
}

Assistant:

std::optional<quint64> QMetaEnum::value64(int index) const
{
    if (!mobj)
        return std::nullopt;
    if (index < 0 || index >= int(data.keyCount()))
        return std::nullopt;

    return value_helper(index);
}